

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void Bind(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  byte *pbVar1;
  undefined1 *puVar2;
  OpCode OVar3;
  Symbol **symRef;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  ParseNodeBin *pPVar7;
  ParseNodeStr *pPVar8;
  ParseNodeJump *pPVar9;
  ParseNodeVar *pPVar10;
  ParseNodeBlock *pPVar11;
  ParseNodePtr *ppPVar12;
  ParseNodeFnc *pPVar13;
  ParseNodeCatch *pPVar14;
  ParseNodeProg *pnode_00;
  ParseNodePtr scope;
  ParseNodeName *pPVar15;
  FuncInfo *pFVar16;
  ParseNodeStmt *pnodeStmt;
  FunctionBody *this;
  ParseNodeRegExp *pPVar17;
  Symbol *pSVar18;
  undefined4 *puVar19;
  ParseNode *pPVar20;
  Symbol *pSVar21;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  OVar3 = pnode->nop;
  switch(OVar3) {
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
switchD_0077d178_caseD_4c:
    pPVar7 = ParseNode::AsParseNodeBin(pnode);
    pPVar20 = pPVar7->pnode1;
    if (pPVar20->nop == knopStr) {
      pPVar8 = ParseNode::AsParseNodeStr(pPVar20);
      ByteCodeGenerator::AssignPropertyId(byteCodeGenerator,pPVar8->pid);
      pbVar1 = (byte *)((long)&pPVar20->grfpn + 1);
      *pbVar1 = *pbVar1 | 0x20;
    }
    break;
  case knopList:
  case knopTemp:
  case knopClassDecl:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopFor:
  case knopIf:
  case knopWhile:
  case knopDoWhile:
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
  case knopStrTemplate:
  case knopWith:
  case knopSwitch:
  case knopCase:
    break;
  case knopVarDecl:
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar10->sym != (Symbol *)0x0) goto LAB_0077d43d;
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    symRef = pPVar10->symRef;
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    pSVar18 = ByteCodeGenerator::FindSymbol(byteCodeGenerator,symRef,pPVar10->pid,false);
    goto LAB_0077d431;
  case knopConstDecl:
  case knopLetDecl:
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar10->sym != (Symbol *)0x0) goto LAB_0077d43d;
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    if ((pPVar10->symRef == (Symbol **)0x0) ||
       (pPVar10 = ParseNode::AsParseNodeVar(pnode), *pPVar10->symRef == (Symbol *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar19 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x11a3,
                         "(pnode->AsParseNodeVar()->symRef && *pnode->AsParseNodeVar()->symRef)",
                         "\'const\' and \'let\' should be binded when we bind block");
      if (!bVar5) goto LAB_0077d77d;
      *puVar19 = 0;
    }
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    pSVar18 = *pPVar10->symRef;
LAB_0077d431:
    pPVar10 = ParseNode::AsParseNodeVar(pnode);
    pPVar10->sym = pSVar18;
LAB_0077d43d:
    SetAdditionalBindInfoForVariables(pnode,byteCodeGenerator);
    return;
  case knopFncDecl:
    pPVar13 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar13->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) != kFunctionNone) {
      pFVar16 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pFVar16->bodyScope);
    }
    pPVar13 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar13->fncFlags & kFunctionDeclaration) == kFunctionNone) {
      pFVar16 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      bVar5 = FuncInfo::IsGlobalFunction(pFVar16);
      if ((!bVar5) || ((byteCodeGenerator->flags & 0x400) != 0)) {
        ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pFVar16->bodyScope);
      }
      ByteCodeGenerator::ProcessCapturedSyms(byteCodeGenerator,pnode);
      return;
    }
    if (byteCodeGenerator->loopDepth != 0) {
      pPVar13 = ParseNode::AsParseNodeFnc(pnode);
      pSVar18 = ParseNodeFnc::GetFuncSymbol(pPVar13);
      if ((pSVar18 != (Symbol *)0x0) &&
         (pSVar21 = Symbol::GetFuncScopeVarSym(pSVar18), pSVar21 != (Symbol *)0x0)) {
        if (pSVar21 == pSVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar19 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x1149,"(funcVarSym != funcSym)","funcVarSym != funcSym");
          if (!bVar5) goto LAB_0077d77d;
          *puVar19 = 0;
        }
        pSVar21->field_0x43 = pSVar21->field_0x43 | 1;
      }
    }
    break;
  case knopProg:
    pnode_00 = ParseNode::AsParseNodeProg(pnode);
    pFVar16 = ByteCodeGenerator::StartBindGlobalStatements(byteCodeGenerator,pnode_00);
    pPVar13 = ParseNode::AsParseNodeFnc(pnode);
    pPVar13->funcInfo = pFVar16;
    pPVar13 = ParseNode::AsParseNodeFnc(pnode);
    scope = ParseNodeFnc::GetParamScope(pPVar13);
    AddFunctionsToScope(scope,byteCodeGenerator);
    pPVar13 = ParseNode::AsParseNodeFnc(pnode);
    AddVarsToScope(pPVar13->pnodeVars,byteCodeGenerator);
    ByteCodeGenerator::SetNumberOfInArgs
              (byteCodeGenerator,(ushort)byteCodeGenerator->flags >> 0xb & 1);
    bVar5 = FuncInfo::IsFakeGlobalFunction(pFVar16,byteCodeGenerator->flags);
    if (bVar5) {
      if (pFVar16->byteCodeFunction != (ParseableFunctionInfo *)0x0) {
        puVar2 = &(pFVar16->byteCodeFunction->super_FunctionProxy).field_0x44;
        *puVar2 = *puVar2 & 0xfd;
      }
    }
    else {
      ByteCodeGenerator::SetRootFuncInfo(byteCodeGenerator,pFVar16);
    }
    pPVar13 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar13->fncFlags & kFunctionCallsEval) != kFunctionNone) {
      pFVar16->field_0xb4 = pFVar16->field_0xb4 | 2;
    }
    break;
  case knopBlock:
    pPVar11 = ParseNode::AsParseNodeBlock(pnode);
LAB_0077d382:
    ppPVar12 = &pPVar11->pnodeScopes;
LAB_0077d386:
    do {
      pPVar20 = *ppPVar12;
      do {
        if (pPVar20 == (ParseNode *)0x0) {
          return;
        }
        OVar3 = pPVar20->nop;
        if (OVar3 == knopCatch) {
          pPVar14 = ParseNode::AsParseNodeCatch(pPVar20);
          ppPVar12 = &pPVar14->pnodeNext;
          goto LAB_0077d386;
        }
        if (OVar3 == knopBlock) {
          pPVar11 = ParseNode::AsParseNodeBlock(pPVar20);
          ppPVar12 = &pPVar11->pnodeNext;
          goto LAB_0077d386;
        }
        if (OVar3 == knopWith) {
          pPVar11 = (ParseNodeBlock *)ParseNode::AsParseNodeWith(pPVar20);
          goto LAB_0077d382;
        }
      } while (OVar3 != knopFncDecl);
      pPVar13 = ParseNode::AsParseNodeFnc(pPVar20);
      if ((pPVar13->fncFlags & kFunctionDeclaration) != kFunctionNone) {
        ByteCodeGenerator::ProcessCapturedSyms(byteCodeGenerator,pPVar20);
      }
      pPVar13 = ParseNode::AsParseNodeFnc(pPVar20);
      ppPVar12 = &pPVar13->pnodeNext;
    } while( true );
  case knopBreak:
  case knopContinue:
    pPVar9 = ParseNode::AsParseNodeJump(pnode);
    pnodeStmt = pPVar9->pnodeTarget;
    goto LAB_0077d535;
  case knopTryCatch:
switchD_0077d178_caseD_69:
    ByteCodeGenerator::SetHasTry(byteCodeGenerator,true);
    pFVar16 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    puVar2 = &(pFVar16->byteCodeFunction->super_FunctionProxy).field_0x47;
    *puVar2 = *puVar2 | 8;
    pnodeStmt = ParseNode::AsParseNodeStmt(pnode);
LAB_0077d535:
    ByteCodeGenerator::AddTargetStmt(byteCodeGenerator,pnodeStmt);
    return;
  default:
    switch(OVar3) {
    case knopCall:
switchD_0077d1f8_caseD_2f:
      BindReference(pnode,byteCodeGenerator);
      return;
    case knopDot:
      BindInstAndMember(pnode,byteCodeGenerator);
      return;
    case knopAsg:
      BindReference(pnode,byteCodeGenerator);
      CheckLocalVarDef(pnode,byteCodeGenerator);
      return;
    case knopInstOf:
    case knopIn:
    case knopEqv:
    case knopNEqv:
      break;
    case knopComma:
      pPVar7 = ParseNode::AsParseNodeBin(pnode);
      puVar2 = &pPVar7->pnode1->field_0x1;
      *puVar2 = *puVar2 | 4;
      break;
    default:
      if (OVar3 == knopName) {
        pPVar15 = ParseNode::AsParseNodeName(pnode);
        pSVar18 = pPVar15->sym;
        if (pSVar18 != (Symbol *)0x0) goto LAB_0077d4f4;
        if (((pPVar15->super_ParseNode).grfpn & 0x2000) != 0) {
          return;
        }
        pSVar18 = ByteCodeGenerator::FindSymbol
                            (byteCodeGenerator,pPVar15->symRef,pPVar15->pid,false);
        if (pSVar18 != (Symbol *)0x0) {
          pPVar20 = pSVar18->decl;
          if (pPVar20 != (ParseNode *)0x0) {
            if ((pPVar15->symRef == (Symbol **)0x0) || (*pPVar15->symRef == (Symbol *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar19 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0x115f,
                                 "(!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef()))"
                                 ,
                                 "!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef())"
                                );
              if (!bVar5) goto LAB_0077d77d;
              *puVar19 = 0;
              pPVar20 = pSVar18->decl;
              if (pPVar20 == (ParseNode *)0x0) goto LAB_0077d73f;
            }
            if (((*pPVar15->symRef)->decl != pPVar20) &&
               (pSVar21 = Symbol::GetFuncScopeVarSym(*pPVar15->symRef), pSVar21 != pSVar18)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar19 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0x1161,
                                 "(!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) || ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym))"
                                 ,
                                 "!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) || ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym)"
                                );
              if (!bVar5) {
LAB_0077d77d:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar19 = 0;
            }
          }
LAB_0077d73f:
          pPVar15->sym = pSVar18;
          if (pSVar18->symbolType != STFunction) goto LAB_0077d4f4;
          if (((pSVar18->field_0x42 & 8) == 0) || ((byteCodeGenerator->flags & 0x400) != 0)) {
            ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pSVar18->scope);
          }
        }
        pSVar18 = pPVar15->sym;
        if (pSVar18 == (Symbol *)0x0) {
          return;
        }
LAB_0077d4f4:
        pSVar18->field_0x43 = pSVar18->field_0x43 | 1;
        return;
      }
      if (OVar3 == knopRegExp) {
        pFVar16 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        this = FuncInfo::GetParsedFunctionBody(pFVar16);
        uVar6 = Js::FunctionBody::NewLiteralRegex(this);
        pPVar17 = ParseNode::AsParseNodeRegExp(pnode);
        pPVar17->regexPatternIndex = uVar6;
        return;
      }
      if (((OVar3 == knopTypeof) || (OVar3 == knopDelete)) || (OVar3 == knopIndex))
      goto switchD_0077d1f8_caseD_2f;
      if (OVar3 == knopTryFinally) {
        ByteCodeGenerator::SetHasFinally(byteCodeGenerator,true);
        goto switchD_0077d178_caseD_69;
      }
      if (OVar3 != knopObjectPatternMember) {
        return;
      }
      goto switchD_0077d178_caseD_4c;
    }
  }
  return;
}

Assistant:

void Bind(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (pnode == nullptr)
{
        return;
    }

    switch (pnode->nop)
    {
    case knopBreak:
    case knopContinue:
        byteCodeGenerator->AddTargetStmt(pnode->AsParseNodeJump()->pnodeTarget);
        break;
    case knopProg:
        {
            FuncInfo* globFuncInfo = byteCodeGenerator->StartBindGlobalStatements(pnode->AsParseNodeProg());
            pnode->AsParseNodeFnc()->funcInfo = globFuncInfo;
            AddFunctionsToScope(pnode->AsParseNodeFnc()->GetTopLevelScope(), byteCodeGenerator);
            AddVarsToScope(pnode->AsParseNodeFnc()->pnodeVars, byteCodeGenerator);
            // There are no args to add, but "eval" gets a this pointer.
            byteCodeGenerator->SetNumberOfInArgs(!!(byteCodeGenerator->GetFlags() & fscrEvalCode));
            if (!globFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                // Global code: the root function is the global function.
                byteCodeGenerator->SetRootFuncInfo(globFuncInfo);
            }
            else if (globFuncInfo->byteCodeFunction)
            {
            // If the current global code wasn't marked to be treated as global code (e.g. from deferred parsing),
            // we don't need to send a register script event for it.
                globFuncInfo->byteCodeFunction->SetIsTopLevel(false);
            }
            if (pnode->AsParseNodeFnc()->CallsEval())
            {
                globFuncInfo->SetCallsEval(true);
            }
            break;
        }
    case knopFncDecl:
        if (pnode->AsParseNodeFnc()->IsCoroutine())
        {
            // Always assume generator functions escape since tracking them requires tracking
            // the resulting generators in addition to the function.
            byteCodeGenerator->FuncEscapes(byteCodeGenerator->TopFuncInfo()->GetBodyScope());
        }
        if (!pnode->AsParseNodeFnc()->IsDeclaration())
        {
            FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();
            if (!funcInfo->IsGlobalFunction() || (byteCodeGenerator->GetFlags() & fscrEval))
            {
                // In the case of a nested function expression, assumes that it escapes.
                // We could try to analyze what it touches to be more precise.
                byteCodeGenerator->FuncEscapes(funcInfo->GetBodyScope());
            }
            byteCodeGenerator->ProcessCapturedSyms(pnode);
        }
        else if (byteCodeGenerator->IsInLoop())
        {
            Symbol *funcSym = pnode->AsParseNodeFnc()->GetFuncSymbol();
            if (funcSym)
            {
                Symbol *funcVarSym = funcSym->GetFuncScopeVarSym();
                if (funcVarSym)
                {
                    // We're going to write to the funcVarSym when we do the function instantiation,
                    // so treat the funcVarSym as used. That way, we know it will get undef-initialized at the
                    // top of the function, so a jitted loop body won't have any issue with boxing if
                    // the function instantiation isn't executed.
                    Assert(funcVarSym != funcSym);
                    funcVarSym->SetIsUsed(true);
                }
            }
        }
        break;
    case knopName:
    {
        ParseNodeName * pnodeName = pnode->AsParseNodeName();
        if (pnodeName->sym == nullptr)
        {
            if (pnodeName->grfpn & fpnMemberReference)
            {
                // This is a member name. No binding.
                break;
            }

            Symbol *sym = byteCodeGenerator->FindSymbol(pnodeName->GetSymRef(), pnodeName->pid);
            if (sym)
            {
                // This is a named load, not just a reference, so if it's a nested function note that all
                // the nested scopes escape.
                Assert(!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef()));
                Assert(!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) ||
                       ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym));

                pnodeName->sym = sym;
                if (sym->GetSymbolType() == STFunction &&
                    (!sym->GetIsGlobal() || (byteCodeGenerator->GetFlags() & fscrEval)))
                {
                    byteCodeGenerator->FuncEscapes(sym->GetScope());
                }
            }
        }

        if (pnodeName->sym)
        {
            pnodeName->sym->SetIsUsed(true);
        }

        break;
    }
    case knopMember:
    case knopMemberShort:
    case knopObjectPatternMember:
    case knopGetMember:
    case knopSetMember:

        {
            // lhs is knopStr, rhs is expr
            ParseNode *id = pnode->AsParseNodeBin()->pnode1;
            if (id->nop == knopStr)
            {
                byteCodeGenerator->AssignPropertyId(id->AsParseNodeStr()->pid);
                id->grfpn |= fpnMemberReference;
            }
            break;
        }

        // TODO: convert index over string to Get/Put Value
    case knopIndex:
        BindReference(pnode, byteCodeGenerator);
        break;
    case knopDot:
        BindInstAndMember(pnode, byteCodeGenerator);
        break;
    case knopTryFinally:
        byteCodeGenerator->SetHasFinally(true);
    case knopTryCatch:
        byteCodeGenerator->SetHasTry(true);
        byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);
        byteCodeGenerator->AddTargetStmt(pnode->AsParseNodeStmt());
        break;
    case knopAsg:
        BindReference(pnode, byteCodeGenerator);
        CheckLocalVarDef(pnode, byteCodeGenerator);
        break;
    case knopVarDecl:
        // "arguments" symbol or decl w/o RHS may have been bound already; otherwise, do the binding here.
        if (pnode->AsParseNodeVar()->sym == nullptr)
        {
            pnode->AsParseNodeVar()->sym = byteCodeGenerator->FindSymbol(pnode->AsParseNodeVar()->symRef, pnode->AsParseNodeVar()->pid);
        }
        SetAdditionalBindInfoForVariables(pnode, byteCodeGenerator);
        break;
    case knopConstDecl:
    case knopLetDecl:
        // "arguments" symbol or decl w/o RHS may have been bound already; otherwise, do the binding here.
        if (!pnode->AsParseNodeVar()->sym)
        {
            AssertMsg(pnode->AsParseNodeVar()->symRef && *pnode->AsParseNodeVar()->symRef, "'const' and 'let' should be binded when we bind block");
            pnode->AsParseNodeVar()->sym = *pnode->AsParseNodeVar()->symRef;
        }
        SetAdditionalBindInfoForVariables(pnode, byteCodeGenerator);
        break;
    case knopCall:
    case knopTypeof:
    case knopDelete:
        BindReference(pnode, byteCodeGenerator);
        break;

    case knopRegExp:
        pnode->AsParseNodeRegExp()->regexPatternIndex = byteCodeGenerator->TopFuncInfo()->GetParsedFunctionBody()->NewLiteralRegex();
        break;

    case knopComma:
        pnode->AsParseNodeBin()->pnode1->SetNotEscapedUse();
        break;

    case knopBlock:
    {
        for (ParseNode *pnodeScope = pnode->AsParseNodeBlock()->pnodeScopes; pnodeScope; /* no increment */)
        {
            switch (pnodeScope->nop)
            {
            case knopFncDecl:
                if (pnodeScope->AsParseNodeFnc()->IsDeclaration())
                {
                    byteCodeGenerator->ProcessCapturedSyms(pnodeScope);
                }
                pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
                break;
            }
        }
        break;
    }

    }
}